

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  size_t sVar5;
  FILE *pFVar6;
  string *psVar7;
  size_t depender_index;
  long lVar8;
  char *pcVar9;
  cmGraphEdge *ni;
  pointer pcVar10;
  
  fprintf(_stderr,"The %s target dependency graph is:\n",(name->_M_dataplus)._M_p);
  pcVar1 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar8 = 0; pFVar6 = _stderr, lVar8 != ((long)pcVar1 - (long)pcVar2) / 0x18; lVar8 = lVar8 + 1
      ) {
    pcVar3 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->Targets).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8]);
    fprintf(pFVar6,"target %zu is [%s]\n",lVar8,(psVar7->_M_dataplus)._M_p);
    pcVar4 = *(pointer *)
              ((long)&pcVar3[lVar8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar10 = *(pointer *)
                    &pcVar3[lVar8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                     super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pFVar6 = _stderr
        , pcVar10 != pcVar4; pcVar10 = pcVar10 + 1) {
      sVar5 = pcVar10->Dest;
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar5]);
      pcVar9 = "weak";
      if (pcVar10->Strong != false) {
        pcVar9 = "strong";
      }
      fprintf(pFVar6,"  depends on target %zu [%s] (%s)\n",sVar5,(psVar7->_M_dataplus)._M_p,pcVar9);
    }
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                          const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  size_t n = graph.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    EdgeList const& nl = graph[depender_index];
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    for (cmGraphEdge const& ni : nl) {
      size_t dependee_index = ni;
      cmGeneratorTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %zu [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni.IsStrong() ? "strong" : "weak");
    }
  }
  fprintf(stderr, "\n");
}